

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall TestMaterial::TestPrecision(TestMaterial *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  ostream *poVar7;
  clock_t cVar8;
  clock_t cVar9;
  uint k;
  int a;
  uint j_1;
  int b;
  ushort uVar10;
  size_t j;
  ulong uVar11;
  long lVar12;
  double dVar13;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  axe;
  vector<double,_std::allocator<double>_> angle;
  Point3 p1;
  Point3 p2;
  long local_a8;
  _Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  local_98;
  _Vector_base<double,_std::allocator<double>_> local_80;
  Point3 local_68;
  Point3 local_48;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"TestPrecision");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
          *)&local_98,10000,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_80,10000,(allocator_type *)&local_68)
  ;
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x12;
  sch::CD_Scene::sceneProximityQuery();
  display();
  lVar12 = -10000;
  uVar10 = 0;
  local_a8 = 0;
  while( true ) {
    cVar1 = (char)(uVar10 / 0x4f);
    cVar6 = (char)uVar10;
    cVar2 = (char)(uVar10 / 0x59);
    cVar3 = (char)(uVar10 / 0x49);
    cVar4 = (char)(uVar10 / 0x57);
    if (lVar12 == 0) break;
    cVar5 = (char)lVar12;
    dVar13 = sin((double)(int)(char)(((byte)(cVar6 + cVar4 * -0x57) / 3) * -3 + cVar4 * -0x57 +
                                     cVar5 + '\x10') * 0.02519999848800003);
    *(double *)((long)&(local_98._M_impl.super__Vector_impl_data._M_start)->m_x + local_a8) = dVar13
    ;
    dVar13 = sin((double)(int)(char)(((byte)(cVar6 + cVar3 * -0x49) / 3) * -3 + cVar3 * -0x49 +
                                     cVar5 + '\x10') * -0.025799998452000032);
    *(double *)((long)&(local_98._M_impl.super__Vector_impl_data._M_start)->m_y + local_a8) = dVar13
    ;
    dVar13 = cos((double)(int)(char)(((byte)(cVar6 + cVar2 * -0x59) / 3) * -3 + cVar2 * -0x59 +
                                     cVar5 + '\x10') * 0.024899999626500004);
    *(double *)((long)&(local_98._M_impl.super__Vector_impl_data._M_start)->m_z + local_a8) = dVar13
    ;
    dVar13 = sin((double)(int)(char)(((byte)(cVar6 + cVar1 * -0x4f) / 3) * -3 + cVar1 * -0x4f +
                                     cVar5 + '\x10') * 0.02909998865100172);
    local_80._M_impl.super__Vector_impl_data._M_start[lVar12 + 10000] = dVar13 * 4.0;
    lVar12 = lVar12 + 1;
    local_a8 = local_a8 + 0x18;
    uVar10 = uVar10 + 1;
  }
  cVar8 = clock();
  for (lVar12 = 0; lVar12 != 10000; lVar12 = lVar12 + 1) {
    for (uVar11 = 0; uVar11 < (ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3);
        uVar11 = uVar11 + 1) {
      sch::S_Object::addRotation
                (*(double **)(*(long *)&this->field_0x8 + uVar11 * 8),
                 (Vector3T *)(local_80._M_impl.super__Vector_impl_data._M_start + lVar12));
    }
    sch::CD_Scene::sceneProximityQuery();
    uVar11 = 0;
    while (a = (int)uVar11,
          uVar11 < (ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3)) {
      for (b = 0; a != b; b = b + 1) {
        local_68.m_x = 0.0;
        local_68.m_y = 0.0;
        local_68.m_z = 0.0;
        local_48.m_x = 0.0;
        local_48.m_y = 0.0;
        local_48.m_z = 0.0;
        sch::CD_Scene::getWitnessPoints(&this->sObj,a,b,&local_68,&local_48);
      }
      uVar11 = (ulong)(a + 1);
    }
    display();
  }
  cVar9 = clock();
  std::operator<<((ostream *)&std::cout,"  computation time: ");
  dVar13 = (double)(cVar9 - cVar8) / 1000000.0;
  poVar7 = std::ostream::_M_insert<double>(dVar13);
  std::operator<<(poVar7," : ");
  poVar7 = std::ostream::_M_insert<double>(dVar13 / 10000.0);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
  std::
  _Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ::~_Vector_base(&local_98);
  return;
}

Assistant:

void TestMaterial::TestPrecision()
{
  std::cout << "TestPrecision" << std::endl;

  std::vector<Vector3> axe(AnimationEnd) ;
  std::vector<double> angle(AnimationEnd) ;

  std::cout.precision(18);

#ifdef DO_TEST
  sObj.sceneProximityQuery();
#endif

  display();

  clock_t begin, end;



#ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_precisiontest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
#endif


#ifdef IRREGULARITIES_COUNTERS
  Scalar previousDistance=2e90;
  int irrCpt=0;
#endif


#ifdef COLLISION_COUNTERS
  int collCpt=0;
  int totalCpt=0;
#endif



  for (long i=0; i<AnimationEnd; i++)
  {
    axe[i][0] =  sin((42)*sin(0.2*AnimationSpeed)*Scalar(i%87%3));
    axe[i][1] =  sin((-43)*sin(0.2*AnimationSpeed)*Scalar(i%73%3));
    axe[i][2] =  cos((83)*sin(0.1*AnimationSpeed)*Scalar(i%89%3));

    angle[i]=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed))*Scalar(i%79%3));

    /*sObj[j]->addTranslation(Vector3(sin((20*(1))*sin(0.2*AnimationSpeed))*(i%67%3),
    sin((71-140*(1))*sin(0.15*AnimationSpeed))*(i%59%3),
    sin((20)*sin(0.2*AnimationSpeed*(i%93%3))))*AnimationScale);
    */
  }



  begin=clock();
  for (long i=0; i<AnimationEnd; i++)
  {
    for (size_t j=0; j<sObj.size(); j++)
      sObj[j]->addRotation(angle[i],axe[i]);

#ifdef DO_TEST
    sObj.sceneProximityQuery();

    for (unsigned k=0; k<sObj.size(); k++)
    {
      for (unsigned j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
# ifndef OUTPUT_FILE
        (void) distance; ///preventing unsused variable warning
#else
        outfile<<p1<<p2<<distance<<std::endl;
# endif
      }
    }

#ifdef IRREGULARITIES_COUNTERS
    Point3 p1,p2;
    Scalar distance=sObj.getWitnessPoints(0,1,p1,p2);
    Scalar distance2=(p1-p2).normsquared();
    if (previousDistance!=2e90)
    {
      if (fabs(fabs(distance)-distance2)>(0.001*(fabs(distance)+distance2)/2))
      {
        irrCpt++;
        std::cout<<"Witness Points Irregularity : "<<i<<' '<<distance<<' '<<distance2<<std::endl;
      }
      if (fabs(distance-previousDistance)>0.1)
      {
        irrCpt++;
        std::cout<<"Coherence Irregularity : "<<i;
      }
    }
    previousDistance=distance;
#endif

#ifdef COLLISION_COUNTERS
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        if (distance<0)
          collCpt++;
        totalCpt++;
      }
    }
#endif

#endif


#ifdef TEST_HOLD
    std::cout<<i<<std::endl;
    system("pause");
#endif

    display();
  }

  end=clock();


#ifdef OUTPUT_FILE
  outfile.close();
#endif



  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) << " : " << ((double)(end - begin) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;

#ifdef IRREGULARITIES_COUNTERS
  std::cout<<"Irregularities : "<<irrCpt<<std::endl;
#endif

#ifdef COLLISION_COUNTERS
  std::cout << "Collisions : "<<collCpt<<std::endl;
#endif
}